

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QLoggingRule>::copyAppend
          (QGenericArrayOps<QLoggingRule> *this,QLoggingRule *b,QLoggingRule *e)

{
  qsizetype *pqVar1;
  QLoggingRule *pQVar2;
  long lVar3;
  Data *pDVar4;
  PatternFlags PVar5;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QLoggingRule>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QLoggingRule>).size;
      pDVar4 = (b->category).d.d;
      pQVar2[lVar3].category.d.d = pDVar4;
      pQVar2[lVar3].category.d.ptr = (b->category).d.ptr;
      pQVar2[lVar3].category.d.size = (b->category).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
      }
      pQVar2[lVar3].enabled = b->enabled;
      PVar5.super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>.
      super_QFlagsStorage<QLoggingRule::PatternFlag>.i =
           (b->flags).super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>;
      pQVar2[lVar3].messageType = b->messageType;
      pQVar2[lVar3].flags =
           (PatternFlags)
           PVar5.super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>.
           super_QFlagsStorage<QLoggingRule::PatternFlag>.i;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QLoggingRule>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }